

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

int gauden_scale_densities_bwd
              (float64 ***den,uint32 ***den_idx,float64 **scale,uint32 *cb,uint32 n_cb,gauden_t *g)

{
  uint uVar1;
  float64 *pfVar2;
  uint32 uVar3;
  ulong uVar4;
  float64 *pfVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  
  uVar4 = (ulong)g->n_top;
  if (g->n_density < g->n_top) {
    __assert_fail("g->n_top <= g->n_density",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,0x53e,
                  "int gauden_scale_densities_bwd(float64 ***, uint32 ***, float64 **, uint32 *, uint32, gauden_t *)"
                 );
  }
  if (n_cb != 0) {
    pfVar2 = *scale;
    uVar7 = (ulong)g->n_feat;
    uVar6 = 0;
    do {
      if ((int)uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        uVar1 = cb[uVar6];
        uVar8 = 0;
        do {
          uVar3 = (uint32)uVar4;
          if ((double)pfVar2[uVar8] <= -708.407751281802) {
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                    ,0x547,"Scaling factor too small: %f\n");
            pfVar2[uVar8] = -698.407751281802;
            uVar3 = g->n_top;
          }
          if (uVar3 == 0) {
            uVar4 = 0;
          }
          else {
            pfVar5 = den[uVar1][uVar8];
            uVar7 = 0;
            do {
              dVar9 = exp((double)pfVar5[uVar7] - (double)pfVar2[uVar8]);
              pfVar5 = den[uVar1][uVar8];
              pfVar5[uVar7] = (float64)dVar9;
              if (0x7fefffffffffffff < (ulong)ABS(dVar9)) {
                __assert_fail("finite(den[c][j][k])",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                              ,0x54c,
                              "int gauden_scale_densities_bwd(float64 ***, uint32 ***, float64 **, uint32 *, uint32, gauden_t *)"
                             );
              }
              uVar7 = uVar7 + 1;
              uVar4 = (ulong)g->n_top;
            } while (uVar7 < uVar4);
          }
          uVar8 = uVar8 + 1;
          uVar7 = (ulong)g->n_feat;
        } while (uVar8 < uVar7);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != n_cb);
  }
  return 0;
}

Assistant:

int
gauden_scale_densities_bwd(float64 ***den,		/* density array for a mixture Gaussian */
			   uint32 ***den_idx,
			   float64 **scale,
			   uint32 *cb,		/* Codebook indices */
			   uint32 n_cb,		/* total # of codebooks to scale */
			   gauden_t *g)		/* Gaussian density structure */
{
    uint32 i, c, j, k;
    float64 *scl;

    /* make sure this is true at initialization time */
    assert(g->n_top <= g->n_density);

    scl = *scale;

    /* Subtract/Divide max density from others */
    for (i = 0; i < n_cb; i++) {
	c = cb[i];
	for (j = 0; j < g->n_feat; j++) {
	    if (scl[j] <= MINUS_LOG_INFINITY) {
		E_WARN("Scaling factor too small: %f\n", scl[j]);
		scl[j] = MINUS_LOG_INFINITY + MAX_LOG_DEN;
	    }
	    for (k = 0; k < g->n_top; k++) {
		den[c][j][k] = exp(den[c][j][k] - scl[j]);
		assert(finite(den[c][j][k]));
	    }
	}
    }
		
    return S3_SUCCESS;
}